

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

Gia_Man_t * Cec_ManChoiceComputation(Gia_Man_t *pAig,Cec_ParChc_t *pParsChc)

{
  Aig_Man_t *pAVar1;
  Gia_Man_t *pGVar2;
  Dch_Pars_t *pPars;
  Dch_Pars_t Pars;
  Dch_Pars_t DStack_58;
  
  pAVar1 = Gia_ManToAig(pAig,0);
  Dch_ManSetDefaultParams(&DStack_58);
  DStack_58.fUseGia = 1;
  DStack_58.nBTLimit = pParsChc->nBTLimit;
  DStack_58.fUseCSat = pParsChc->fUseCSat;
  DStack_58.fVerbose = pParsChc->fVerbose;
  pAVar1 = Dar_ManChoiceNew(pAVar1,&DStack_58);
  pGVar2 = Gia_ManFromAig(pAVar1);
  Aig_ManStop(pAVar1);
  return pGVar2;
}

Assistant:

Gia_Man_t * Cec_ManChoiceComputation( Gia_Man_t * pAig, Cec_ParChc_t * pParsChc )
{
//    extern Aig_Man_t * Dar_ManChoiceNew( Aig_Man_t * pAig, Dch_Pars_t * pPars );
    Dch_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pMan, * pManNew;
    Gia_Man_t * pGia;
    if ( 0 ) 
    {
        pGia = Cec_ManChoiceComputationVec( pAig, 3, pParsChc );
    }
    else
    {
        pMan = Gia_ManToAig( pAig, 0 );
        Dch_ManSetDefaultParams( pPars );
        pPars->fUseGia  = 1;
        pPars->nBTLimit = pParsChc->nBTLimit;
        pPars->fUseCSat = pParsChc->fUseCSat;
        pPars->fVerbose = pParsChc->fVerbose;
        pManNew = Dar_ManChoiceNew( pMan, pPars );
        pGia = Gia_ManFromAig( pManNew );
        Aig_ManStop( pManNew );
//        Aig_ManStop( pMan );
    }
    return pGia;
}